

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

void __thiscall helics::CloneFilterOperation::CloneFilterOperation(CloneFilterOperation *this)

{
  pointer p_Var1;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<helics::CloneOperator,_std::allocator<helics::CloneOperator>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_48;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  (this->super_FilterOperations)._vptr_FilterOperations =
       (_func_int **)&PTR__CloneFilterOperation_00447c40;
  (this->op).super___shared_ptr<helics::CloneOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = std::
           allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<helics::CloneOperator,_std::allocator<helics::CloneOperator>,_(__gnu_cxx::_Lock_policy)2>_>_>
           ::allocate(&__a2,1);
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_004481a0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_(const_helics::Message_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:461:40)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_(const_helics::Message_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:461:40)>
             ::_M_manager;
  local_48._M_alloc = &__a2;
  local_48._M_ptr = p_Var1;
  local_38._M_unused._M_object = this;
  CloneOperator::CloneOperator
            ((CloneOperator *)&p_Var1->_M_impl,
             (function<std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_(const_helics::Message_*)>
              *)&local_38);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  local_48._M_ptr = (pointer)0x0;
  (this->op).super___shared_ptr<helics::CloneOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = &p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
  (this->op).super___shared_ptr<helics::CloneOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&p_Var1->_M_impl;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<helics::CloneOperator,_std::allocator<helics::CloneOperator>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_48);
  (this->deliveryAddresses).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->deliveryAddresses).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  *(undefined8 *)((long)&(this->deliveryAddresses).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->deliveryAddresses).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  *(undefined8 *)((long)&(this->deliveryAddresses).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->deliveryAddresses).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  (this->deliveryAddresses).m_obj.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->deliveryAddresses).m_mutex._M_impl._M_rwlock.__align = 0;
  (this->deliveryAddresses).m_obj.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deliveryAddresses).m_obj.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

CloneFilterOperation::CloneFilterOperation():
    op(std::make_shared<CloneOperator>([this](const Message* mess) { return sendMessage(mess); }))
{
}